

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O0

int is_prime(uint64_t n)

{
  ulong in_RDI;
  uint64_t r;
  size_t cnt;
  uint64_t tmp;
  uint64_t a;
  size_t i;
  uint64_t bases [7];
  uint64_t d;
  uint64_t t;
  uint64_t s;
  ulong in_stack_ffffffffffffff70;
  uint64_t in_stack_ffffffffffffff78;
  uint64_t in_stack_ffffffffffffff80;
  ulong local_70;
  ulong local_68 [8];
  ulong local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  uint local_4;
  
  if (((in_RDI & 1) == 0) || (in_RDI == 1)) {
    local_4 = (uint)(in_RDI == 2);
  }
  else {
    local_18 = 1;
    for (local_20 = 2; (in_RDI - 1) % (local_20 << 1) == 0; local_20 = local_20 << 1) {
      local_18 = local_18 + 1;
    }
    local_28 = (in_RDI - 1) / local_20;
    local_10 = in_RDI;
    memcpy(local_68,&DAT_00103010,0x38);
    for (local_70 = 0; (local_70 < 7 && (local_68[local_70] < local_10)); local_70 = local_70 + 1) {
      in_stack_ffffffffffffff80 =
           expmod(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if ((in_stack_ffffffffffffff80 != 1) && (in_stack_ffffffffffffff80 != local_10 - 1)) {
        in_stack_ffffffffffffff78 = 0;
        for (in_stack_ffffffffffffff70 = 1; in_stack_ffffffffffffff70 < local_18;
            in_stack_ffffffffffffff70 = in_stack_ffffffffffffff70 + 1) {
          in_stack_ffffffffffffff80 =
               mulmod(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70)
          ;
          if (in_stack_ffffffffffffff80 != local_10 - 1) {
            in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 1;
          }
        }
        if (in_stack_ffffffffffffff78 == local_18 - 1) {
          return 0;
        }
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int is_prime(uint64_t n) {
    if(n % 2 == 0 || n == 1)
        return n == 2 ? 1 : 0;

    // perform (deterministic) Miller-Rabin primality test

    uint64_t s = 1;
    uint64_t t = 2;
    while((n-1) % (t<<1) == 0) {
        s++;
        t <<= 1;
    }
    uint64_t d = (n-1) / t;

    // these bases should be sufficient to test all n < 2^64
    uint64_t bases[] = {2, 325, 9375, 28178, 450775, 9780504, 1795265022};

    for(size_t i = 0; i < 7; i++) {
        uint64_t a = bases[i];
        if(a >= n)
            break;

        uint64_t tmp = expmod(a, d, n);
        if(tmp != 1 && tmp != n-1) {
            size_t cnt = 0;
            for(uint64_t r = 1; r < s; r++) {
                tmp = mulmod(tmp, tmp, n);
                if(tmp != n-1)
                    cnt++;
            }
            if(cnt == s-1)
                return 0;
        }

    }

    return 1;
}